

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_props.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  ALLEGRO_SAMPLE_INSTANCE *pAVar1;
  char cVar2;
  uint instance_len;
  ALLEGRO_DISPLAY *display;
  undefined8 uVar3;
  undefined8 extraout_RAX;
  char *pcVar4;
  Theme theme;
  Prog prog;
  Theme TStack_5b8;
  Prog local_580;
  
  if (argc < 2) {
    pcVar4 = "data/welcome.wav";
  }
  else {
    pcVar4 = argv[1];
  }
  cVar2 = al_install_system(0x5020700,atexit);
  if (cVar2 == '\0') {
    pcVar4 = "Could not init Allegro\n";
  }
  else {
    al_install_keyboard();
    al_install_mouse();
    al_init_font_addon();
    al_init_primitives_addon();
    al_init_acodec_addon();
    cVar2 = al_install_audio();
    if (cVar2 == '\0') {
      pcVar4 = "Could not init sound!\n";
    }
    else {
      cVar2 = al_reserve_samples(1);
      if (cVar2 == '\0') {
        pcVar4 = "Could not set up voice and mixer.\n";
      }
      else {
        sample = (ALLEGRO_SAMPLE *)al_load_sample(pcVar4);
        if (sample == (ALLEGRO_SAMPLE *)0x0) {
          abort_example("Could not load sample from \'%s\'!\n",pcVar4);
        }
        else {
          al_set_new_display_flags(0x40);
          display = (ALLEGRO_DISPLAY *)al_create_display(0x280,0x1e0);
          if (display != (ALLEGRO_DISPLAY *)0x0) {
            font_gui = (ALLEGRO_FONT *)al_create_builtin_font();
            if (font_gui != (ALLEGRO_FONT *)0x0) {
              sample_inst = (ALLEGRO_SAMPLE_INSTANCE *)al_create_sample_instance(sample);
              al_set_sample_instance_playmode(sample_inst,0x101);
              pAVar1 = sample_inst;
              uVar3 = al_get_default_mixer();
              al_attach_sample_instance_to_mixer(pAVar1,uVar3);
              al_play_sample_instance(sample_inst);
              Theme::Theme(&TStack_5b8,font_gui);
              instance_len = al_get_sample_instance_length(sample_inst);
              Prog::Prog(&local_580,&TStack_5b8,display,instance_len);
              Prog::run(&local_580);
              Prog::~Prog(&local_580);
              al_destroy_sample_instance(sample_inst);
              al_destroy_sample(sample);
              al_uninstall_audio();
              al_destroy_font(font_gui);
              return 0;
            }
            pcVar4 = "Failed to create builtin font\n";
            font_gui = (ALLEGRO_FONT *)0x0;
            goto LAB_00107595;
          }
        }
        pcVar4 = "Unable to create display\n";
      }
    }
  }
LAB_00107595:
  abort_example(pcVar4);
  Prog::~Prog(&local_580);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   const char *filename;

   if (argc >= 2) {
      filename = argv[1];
   }
   else {
      filename = "data/welcome.wav";
   }

   if (!al_init()) {
      abort_example("Could not init Allegro\n");
   }
   al_install_keyboard();
   al_install_mouse();

   al_init_font_addon();
   al_init_primitives_addon();
   al_init_acodec_addon();
   init_platform_specific();

   if (!al_install_audio()) {
      abort_example("Could not init sound!\n");
   }

   if (!al_reserve_samples(1)) {
      abort_example("Could not set up voice and mixer.\n");
   }

   sample = al_load_sample(filename);
   if (!sample) {
      abort_example("Could not load sample from '%s'!\n", filename);
   }

   al_set_new_display_flags(ALLEGRO_GENERATE_EXPOSE_EVENTS);
   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Unable to create display\n");
   }

   font_gui = al_create_builtin_font();
   if (!font_gui) {
      abort_example("Failed to create builtin font\n");
   }

   /* Loop the sample. */
   sample_inst = al_create_sample_instance(sample);
   al_set_sample_instance_playmode(sample_inst, ALLEGRO_PLAYMODE_LOOP);
   al_attach_sample_instance_to_mixer(sample_inst, al_get_default_mixer());
   al_play_sample_instance(sample_inst);

   /* Don't remove these braces. */
   {
      Theme theme(font_gui);
      Prog prog(theme, display, al_get_sample_instance_length(sample_inst));
      prog.run();
   }

   al_destroy_sample_instance(sample_inst);
   al_destroy_sample(sample);
   al_uninstall_audio();

   al_destroy_font(font_gui);

   return 0;

   (void)argc;
   (void)argv;
}